

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::inputMethodEvent(QWidgetTextControlPrivate *this,QInputMethodEvent *e)

{
  QTextCursor *this_00;
  QTextFormat *this_01;
  long lVar1;
  QWidgetTextControl *this_02;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QList_conflict *pQVar11;
  iterator iVar12;
  const_iterator before;
  iterator iVar13;
  QTextCursorPrivate *pQVar14;
  int i_1;
  long lVar15;
  MoveMode MVar16;
  int iVar17;
  int i;
  ulong uVar18;
  long in_FS_OFFSET;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  QTextCursor oldCursor;
  int iStack_94;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QTextFormat local_78 [16];
  Data *local_68;
  undefined8 local_60;
  QTextCursor c;
  undefined4 uStack_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x11) != 0) {
    this_02 = *(QWidgetTextControl **)&this->field_0x8;
    this_00 = &this->cursor;
    cVar3 = QTextCursor::isNull();
    if (cVar3 == '\0') {
      if (*(long *)(e + 0x38) == 0) {
        QTextCursor::block();
        QTextBlock::layout();
        QTextLayout::preeditAreaText();
        bVar4 = ::operator!=((QString *)(e + 0x10),(QString *)&c);
        if (bVar4) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&c);
          goto LAB_0047edac;
        }
        iVar5 = *(int *)(e + 0x5c);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&c);
        bVar4 = true;
        if (iVar5 < 1) {
          if (*(long *)(e + 0x50) == 0) goto LAB_0047ed49;
          bVar4 = false;
        }
      }
      else {
LAB_0047edac:
        bVar4 = true;
      }
      iVar5 = QTextCursor::position();
      QTextCursor::beginEditBlock();
      if (bVar4) {
        QTextCursor::removeSelectedText();
      }
      local_68 = (Data *)0x0;
      local_60 = 0xaaaaaaaa00000000;
      if ((*(long *)(e + 0x38) != 0) || (*(int *)(e + 0x5c) != 0)) {
        cVar3 = QString::endsWith((QChar)((short)e + L'('),10);
        if (cVar3 != '\0') {
          QTextCursor::block();
          local_68 = _c;
          local_60 = CONCAT44(local_60._4_4_,uStack_50);
        }
        _c = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor(&c,this_00);
        iVar6 = QTextCursor::position();
        iVar7 = (int)&c;
        QTextCursor::setPosition(iVar7,iVar6 + *(int *)(e + 0x58));
        iVar6 = QTextCursor::position();
        QTextCursor::setPosition(iVar7,iVar6 + *(int *)(e + 0x5c));
        QTextCursor::insertText((QString *)&c);
        QTextCursor::~QTextCursor(&c);
      }
      lVar15 = 8;
      for (uVar18 = 0; uVar18 < *(ulong *)(e + 0x50); uVar18 = uVar18 + 1) {
        lVar2 = *(long *)(e + 0x48);
        if (*(int *)(lVar2 + -8 + lVar15) == 4) {
          _oldCursor = &DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor(&oldCursor,this_00);
          iVar6 = *(int *)(lVar2 + -4 + lVar15);
          QTextCursor::block();
          iVar7 = QTextBlock::position();
          MVar16 = iVar6 + iVar7;
          QTextCursor::setPosition((int)this_00,MVar16);
          QTextCursor::setPosition((int)this_00,MVar16 + *(int *)(lVar2 + lVar15));
          (**(code **)(*(long *)this_02 + 0x60))();
          repaintOldAndNewSelection(this,&oldCursor);
          QTextCursor::~QTextCursor(&oldCursor);
        }
        lVar15 = lVar15 + 0x30;
      }
      cVar3 = QTextBlock::isValid();
      if (cVar3 == '\0') {
        QTextCursor::block();
        local_68 = _c;
        local_60 = CONCAT44(local_60._4_4_,uStack_50);
      }
      pQVar11 = (QList_conflict *)QTextBlock::layout();
      if (bVar4) {
        iVar6 = QTextCursor::position();
        iVar7 = QTextBlock::position();
        QTextLayout::setPreeditArea((int)pQVar11,(QString *)(ulong)(uint)(iVar6 - iVar7));
      }
      _c = (Data *)0x0;
      QList<QTextLayout::FormatRange>::reserve
                ((QList<QTextLayout::FormatRange> *)&c,*(qsizetype *)(e + 0x50));
      iVar6 = this->preeditCursor;
      this->preeditCursor = *(int *)(e + 0x20);
      this->hideCursor = false;
      for (uVar18 = 0; uVar18 < *(ulong *)(e + 0x50); uVar18 = uVar18 + 1) {
        lVar15 = *(long *)(e + 0x48) + uVar18 * 0x30;
        iVar7 = *(int *)(*(long *)(e + 0x48) + uVar18 * 0x30);
        if (iVar7 == 0) {
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::charFormat();
          qvariant_cast<QTextFormat>((QVariant *)local_78);
          QTextFormat::toCharFormat();
          QTextFormat::merge((QTextFormat *)local_b8);
          QTextFormat::~QTextFormat((QTextFormat *)&oldCursor);
          QTextFormat::~QTextFormat(local_78);
          bVar4 = QTextFormat::isCharFormat((QTextFormat *)local_b8);
          if (bVar4) {
            local_88 = &DAT_aaaaaaaaaaaaaaaa;
            _oldCursor = &DAT_aaaaaaaaaaaaaaaa;
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_90);
            iVar7 = *(int *)(lVar15 + 4);
            iVar8 = QTextCursor::position();
            iVar9 = QTextBlock::position();
            _oldCursor = (undefined1 *)CONCAT44(*(undefined4 *)(lVar15 + 8),(iVar8 + iVar7) - iVar9)
            ;
            QTextFormat::operator=((QTextFormat *)&puStack_90,(QTextFormat *)local_b8);
            iVar12 = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&c);
            do {
              before.i = iVar12.i;
              iVar12 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&c)
              ;
              if (before.i == iVar12.i) goto LAB_0047f194;
              iVar12.i = before.i + -1;
            } while (_oldCursor < before.i[-1].start);
            QList<QTextLayout::FormatRange>::insert
                      ((QList<QTextLayout::FormatRange> *)&c,before,(parameter_type)&oldCursor);
LAB_0047f194:
            iVar12 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&c);
            if (before.i == iVar12.i) {
              QList<QTextLayout::FormatRange>::emplaceFront<QTextLayout::FormatRange_const&>
                        ((QList<QTextLayout::FormatRange> *)&c,(FormatRange *)&oldCursor);
            }
            QTextFormat::~QTextFormat((QTextFormat *)&puStack_90);
          }
          QTextFormat::~QTextFormat((QTextFormat *)local_b8);
        }
        else if (iVar7 == 1) {
          this->preeditCursor = *(int *)(lVar15 + 4);
          this->hideCursor = *(int *)(lVar15 + 8) == 0;
        }
      }
      QTextCursor::charFormat();
      bVar4 = QTextFormat::isCharFormat((QTextFormat *)&oldCursor);
      QTextFormat::~QTextFormat((QTextFormat *)&oldCursor);
      if (bVar4) {
        iVar9 = QTextCursor::position();
        iVar10 = QTextBlock::position();
        iVar7 = *(int *)(e + 0x20);
        iVar12 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&c);
        iVar8 = iVar9 - iVar10;
        while( true ) {
          iVar13 = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&c);
          if (iVar12.i == iVar13.i) break;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          _oldCursor = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          QTextLayout::FormatRange::FormatRange((FormatRange *)&oldCursor,iVar12.i);
          iVar17 = _oldCursor - iVar8;
          if (iVar17 != 0 && iVar8 <= _oldCursor) {
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            this_01 = (QTextFormat *)(local_b8 + 8);
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)this_01);
            local_b8._4_4_ = iVar17;
            local_b8._0_4_ = iVar8;
            QTextCursor::charFormat();
            QTextFormat::operator=(this_01,local_78);
            QTextFormat::~QTextFormat(local_78);
            iVar12 = QList<QTextLayout::FormatRange>::insert
                               ((QList<QTextLayout::FormatRange> *)&c,iVar12.i,
                                (parameter_type)local_b8);
            iVar12.i = iVar12.i + 1;
            QTextFormat::~QTextFormat(this_01);
          }
          iVar12.i = iVar12.i + 1;
          iVar8 = _oldCursor + iStack_94;
          QTextFormat::~QTextFormat((QTextFormat *)&puStack_90);
        }
        iVar7 = (iVar9 - iVar10) + iVar7;
        iVar9 = iVar7 - iVar8;
        if (iVar9 != 0 && iVar8 <= iVar7) {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          _oldCursor = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_90);
          _oldCursor = (undefined1 *)CONCAT44(iVar9,iVar8);
          QTextCursor::charFormat();
          QTextFormat::operator=((QTextFormat *)&puStack_90,(QTextFormat *)local_b8);
          QTextFormat::~QTextFormat((QTextFormat *)local_b8);
          QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                    ((QList<QTextLayout::FormatRange> *)&c,(FormatRange *)&oldCursor);
          QTextFormat::~QTextFormat((QTextFormat *)&puStack_90);
        }
      }
      QTextLayout::setFormats(pQVar11);
      QTextCursor::endEditBlock();
      pQVar14 = QSharedDataPointer::operator_cast_to_QTextCursorPrivate_
                          ((QSharedDataPointer *)this_00);
      if (pQVar14 != (QTextCursorPrivate *)0x0) {
        QSharedDataPointer<QTextCursorPrivate>::operator->
                  ((QSharedDataPointer<QTextCursorPrivate> *)this_00);
        QTextCursorPrivate::setX();
      }
      iVar7 = QTextCursor::position();
      if (iVar5 != iVar7) {
        QWidgetTextControl::cursorPositionChanged(this_02);
      }
      if (iVar6 != this->preeditCursor) {
        QWidgetTextControl::microFocusChanged(this_02);
      }
      QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer
                ((QArrayDataPointer<QTextLayout::FormatRange> *)&c);
      goto LAB_0047f418;
    }
  }
LAB_0047ed49:
  e[0xc] = (QInputMethodEvent)0x0;
LAB_0047f418:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::inputMethodEvent(QInputMethodEvent *e)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & (Qt::TextEditable | Qt::TextSelectableByMouse)) || cursor.isNull()) {
        e->ignore();
        return;
    }
    bool isGettingInput = !e->commitString().isEmpty()
            || e->preeditString() != cursor.block().layout()->preeditAreaText()
            || e->replacementLength() > 0;

    if (!isGettingInput && e->attributes().isEmpty()) {
        e->ignore();
        return;
    }

    int oldCursorPos = cursor.position();

    cursor.beginEditBlock();
    if (isGettingInput) {
        cursor.removeSelectedText();
    }

    QTextBlock block;

    // insert commit string
    if (!e->commitString().isEmpty() || e->replacementLength()) {
        if (e->commitString().endsWith(QChar::LineFeed))
            block = cursor.block(); // Remember the block where the preedit text is
        QTextCursor c = cursor;
        c.setPosition(c.position() + e->replacementStart());
        c.setPosition(c.position() + e->replacementLength(), QTextCursor::KeepAnchor);
        c.insertText(e->commitString());
    }

    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Selection) {
            QTextCursor oldCursor = cursor;
            int blockStart = a.start + cursor.block().position();
            cursor.setPosition(blockStart, QTextCursor::MoveAnchor);
            cursor.setPosition(blockStart + a.length, QTextCursor::KeepAnchor);
            q->ensureCursorVisible();
            repaintOldAndNewSelection(oldCursor);
        }
    }

    if (!block.isValid())
        block = cursor.block();
    QTextLayout *layout = block.layout();
    if (isGettingInput)
        layout->setPreeditArea(cursor.position() - block.position(), e->preeditString());
    QList<QTextLayout::FormatRange> overrides;
    overrides.reserve(e->attributes().size());
    const int oldPreeditCursor = preeditCursor;
    preeditCursor = e->preeditString().size();
    hideCursor = false;
    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Cursor) {
            preeditCursor = a.start;
            hideCursor = !a.length;
        } else if (a.type == QInputMethodEvent::TextFormat) {
            QTextCharFormat f = cursor.charFormat();
            f.merge(qvariant_cast<QTextFormat>(a.value).toCharFormat());
            if (f.isValid()) {
                QTextLayout::FormatRange o;
                o.start = a.start + cursor.position() - block.position();
                o.length = a.length;
                o.format = f;

                // Make sure list is sorted by start index
                QList<QTextLayout::FormatRange>::iterator it = overrides.end();
                while (it != overrides.begin()) {
                    QList<QTextLayout::FormatRange>::iterator previous = it - 1;
                    if (o.start >= previous->start) {
                        overrides.insert(it, o);
                        break;
                    }
                    it = previous;
                }

                if (it == overrides.begin())
                    overrides.prepend(o);
            }
        }
    }

    if (cursor.charFormat().isValid()) {
        int start = cursor.position() - block.position();
        int end = start + e->preeditString().size();

        QList<QTextLayout::FormatRange>::iterator it = overrides.begin();
        while (it != overrides.end()) {
            QTextLayout::FormatRange range = *it;
            int rangeStart = range.start;
            if (rangeStart > start) {
                QTextLayout::FormatRange o;
                o.start = start;
                o.length = rangeStart - start;
                o.format = cursor.charFormat();
                it = overrides.insert(it, o) + 1;
            }

            ++it;
            start = range.start + range.length;
        }

        if (start < end) {
            QTextLayout::FormatRange o;
            o.start = start;
            o.length = end - start;
            o.format = cursor.charFormat();
            overrides.append(o);
        }
    }
    layout->setFormats(overrides);

    cursor.endEditBlock();

    if (cursor.d)
        cursor.d->setX();
    if (oldCursorPos != cursor.position())
        emit q->cursorPositionChanged();
    if (oldPreeditCursor != preeditCursor)
        emit q->microFocusChanged();
}